

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int parse_opt_open_file(int argc,char **argv)

{
  uint64_t uVar1;
  int iVar2;
  FILE *__stream;
  size_t sVar3;
  uint64_t local_430;
  uint64_t malloc_size;
  FILE *input;
  char local_418 [7];
  char c;
  char filename [1024];
  char **argv_local;
  int argc_local;
  
  filename._1016_8_ = argv;
  do {
    iVar2 = getopt(argc,(char **)filename._1016_8_,(char *)0x0);
  } while ((char)iVar2 != -1);
  strcpy(local_418,*(char **)(filename._1016_8_ + (long)(argc + -1) * 8));
  __stream = fopen(local_418,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"Error open input file\n");
  }
  else {
    fseek(__stream,0,2);
    buf_size = ftell(__stream);
    fseek(__stream,0,0);
    for (local_430 = buf_size; (local_430 & 3) != 0; local_430 = local_430 + 1) {
    }
    buf = (uint8_t *)malloc(local_430);
    uVar1 = buf_size;
    if (buf == (uint8_t *)0x0) {
      fprintf(_stderr,"Error malloc file buf\n");
    }
    else {
      sVar3 = fread(buf,1,buf_size,__stream);
      if (uVar1 == sVar3) {
        fclose(__stream);
        return 0;
      }
    }
  }
  if (buf != (uint8_t *)0x0) {
    free(buf);
  }
  fclose(__stream);
  return -1;
}

Assistant:

int parse_opt_open_file(int argc, char * const *argv)
{
    char filename[1024];
    char c;

    while((c = getopt(argc, argv, NULL)) != -1)
    {
        //to add options
    }
    strcpy(filename, argv[argc - 1]);

    FILE *input = fopen(filename, "rb");
    if(!input)
    {
        fprintf(stderr, "Error open input file\n");
        goto ERR;
    }
    fseek(input, 0, SEEK_END);
    buf_size = (uint64_t)ftell(input);
    fseek(input, 0, SEEK_SET);
    uint64_t malloc_size = buf_size;
    while(malloc_size % 4)
        malloc_size++;
    buf = (uint8_t *)malloc(sizeof(uint8_t) * malloc_size);
    if(!buf)
    {
        fprintf(stderr, "Error malloc file buf\n");
        goto ERR;
    }

    if(buf_size != fread(buf, 1, buf_size, input))
        goto ERR;
    fclose(input);
    return 0;
ERR:
    if(buf)
        free(buf);
    fclose(input);
    return -1;
}